

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsencoding.h
# Opt level: O0

void __thiscall
vsencoding::VSEncodingBlocks::encodeVS
          (VSEncodingBlocks *this,uint32_t len,uint32_t *in,uint32_t *size,uint32_t *out)

{
  uint32_t uVar1;
  ulong uVar2;
  BitsWriter *this_00;
  void *pvVar3;
  uint32_t *in_RCX;
  long in_RDX;
  uint in_ESI;
  uint32_t *in_R8;
  BitsWriter *wt;
  uint32_t countBlocksLogs [16];
  uint32_t blockCur [16];
  uint32_t *blocks [16];
  uint32_t *part;
  uint32_t ntotal;
  uint32_t maxB;
  uint32_t numBlocks;
  uint32_t *logs;
  uint32_t j;
  uint32_t i;
  uint32_t auStackY_158 [16];
  uint auStackY_118 [4];
  uint32_t *in_stack_fffffffffffffef8;
  uint32_t in_stack_ffffffffffffff00;
  uint32_t in_stack_ffffffffffffff04;
  uint32_t *in_stack_ffffffffffffff08;
  VSEncoding *in_stack_ffffffffffffff10;
  long local_d8 [17];
  uint32_t *local_50;
  uint32_t local_44;
  uint local_40;
  uint local_3c;
  void *local_38;
  uint local_30;
  uint local_2c;
  uint32_t *local_28;
  uint32_t *local_20;
  long local_18;
  uint local_c;
  
  uVar2 = SUB168(ZEXT416(in_ESI) * ZEXT816(4),0);
  if (SUB168(ZEXT416(in_ESI) * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_38 = operator_new__(uVar2);
  if (local_38 == (void *)0x0) {
    fprintf(_stderr,"Can\'t allocate memory\n");
  }
  for (local_2c = 0; local_2c < local_c; local_2c = local_2c + 1) {
    uVar1 = FastPForLib::asmbits(*(uint32_t *)(local_18 + (ulong)local_2c * 4));
    *(undefined4 *)((long)local_38 + (ulong)local_2c * 4) =
         *(undefined4 *)(__vseblocks_remapLogs + (ulong)(uVar1 + 1) * 4);
  }
  local_50 = VSEncoding::compute_OptPartition
                       (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                        in_stack_ffffffffffffff04,in_stack_ffffffffffffff00,
                        in_stack_fffffffffffffef8);
  this_00 = (BitsWriter *)operator_new(0x20);
  BitsWriter::BitsWriter(this_00,local_28);
  if (this_00 == (BitsWriter *)0x0) {
    fprintf(_stderr,"Can\'t initialize a class\n");
  }
  for (local_2c = 0; local_2c < 0x10; local_2c = local_2c + 1) {
    auStackY_158[local_2c] = 0;
    auStackY_118[local_2c] = 0;
  }
  for (local_2c = 0; local_2c < local_3c; local_2c = local_2c + 1) {
    local_40 = 0;
    for (local_30 = local_50[local_2c]; local_30 < local_50[local_2c + 1]; local_30 = local_30 + 1)
    {
      if (local_40 < *(uint *)((long)local_38 + (ulong)local_30 * 4)) {
        local_40 = *(uint *)((long)local_38 + (ulong)local_30 * 4);
      }
    }
    auStackY_158[*(uint *)(__vseblocks_codeLogs + (ulong)local_40 * 4)] =
         (local_50[local_2c + 1] - local_50[local_2c]) +
         auStackY_158[*(uint *)(__vseblocks_codeLogs + (ulong)local_40 * 4)];
  }
  local_44 = 0;
  for (local_2c = 1; local_2c < 0x10; local_2c = local_2c + 1) {
    if (auStackY_158[local_2c] != 0) {
      local_44 = local_44 + 1;
    }
  }
  BitsWriter::bit_writer(this_00,local_44,0x20);
  for (local_2c = 1; local_2c < 0x10; local_2c = local_2c + 1) {
    if (auStackY_158[local_2c] != 0) {
      BitsWriter::bit_writer(this_00,auStackY_158[local_2c],0x1c);
      BitsWriter::bit_writer(this_00,local_2c,4);
    }
  }
  local_d8[0] = 0;
  for (local_2c = 1; local_2c < 0x10; local_2c = local_2c + 1) {
    if (auStackY_158[local_2c] == 0) {
      local_d8[local_2c] = 0;
    }
    else {
      uVar2 = SUB168(ZEXT416(auStackY_158[local_2c]) * ZEXT816(4),0);
      if (SUB168(ZEXT416(auStackY_158[local_2c]) * ZEXT816(4),8) != 0) {
        uVar2 = 0xffffffffffffffff;
      }
      pvVar3 = operator_new__(uVar2);
      local_d8[local_2c] = (long)pvVar3;
      if (local_d8[local_2c] == 0) {
        fprintf(_stderr,"Can\'t allocate memory\n");
      }
    }
  }
  for (local_2c = 0; local_2c < local_3c; local_2c = local_2c + 1) {
    local_40 = 0;
    for (local_30 = local_50[local_2c]; local_30 < local_50[local_2c + 1]; local_30 = local_30 + 1)
    {
      if (local_40 < *(uint *)((long)local_38 + (ulong)local_30 * 4)) {
        local_40 = *(uint *)((long)local_38 + (ulong)local_30 * 4);
      }
    }
    if (local_40 != 0) {
      for (local_30 = local_50[local_2c]; local_30 < local_50[local_2c + 1]; local_30 = local_30 + 1
          ) {
        *(undefined4 *)
         (local_d8[*(uint *)(__vseblocks_codeLogs + (ulong)local_40 * 4)] +
         (ulong)auStackY_118[*(uint *)(__vseblocks_codeLogs + (ulong)local_40 * 4)] * 4) =
             *(undefined4 *)(local_18 + (ulong)local_30 * 4);
        auStackY_118[*(uint *)(__vseblocks_codeLogs + (ulong)local_40 * 4)] =
             auStackY_118[*(uint *)(__vseblocks_codeLogs + (ulong)local_40 * 4)] + 1;
      }
    }
  }
  for (local_2c = 1; local_2c < 0x10; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < auStackY_158[local_2c]; local_30 = local_30 + 1) {
      BitsWriter::bit_writer
                (this_00,*(uint32_t *)(local_d8[local_2c] + (ulong)local_30 * 4),
                 *(uint32_t *)(__vseblocks_possLogs + (ulong)local_2c * 4));
    }
    if (auStackY_158[local_2c] != 0) {
      BitsWriter::bit_flush(this_00);
    }
  }
  BitsWriter::bit_flush(this_00);
  for (local_2c = 0; local_2c < local_3c; local_2c = local_2c + 1) {
    local_30 = local_50[local_2c];
    local_40 = 0;
    for (; local_30 < local_50[local_2c + 1]; local_30 = local_30 + 1) {
      if (local_40 < *(uint *)((long)local_38 + (ulong)local_30 * 4)) {
        local_40 = *(uint *)((long)local_38 + (ulong)local_30 * 4);
      }
    }
    if (local_40 == 0) {
      local_30 = 0;
      while ((local_30 < 0x10 &&
             (local_50[local_2c + 1] - local_50[local_2c] !=
              *(int *)(__vseblocks_posszLens + (ulong)local_30 * 4)))) {
        local_30 = local_30 + 1;
      }
    }
    else {
      local_30 = 0;
      while ((local_30 < 0x10 &&
             (local_50[local_2c + 1] - local_50[local_2c] !=
              *(int *)(__vseblocks_possLens + (ulong)local_30 * 4)))) {
        local_30 = local_30 + 1;
      }
    }
    BitsWriter::bit_writer(this_00,*(uint32_t *)(__vseblocks_codeLogs + (ulong)local_40 * 4),4);
    BitsWriter::bit_writer(this_00,local_30,4);
  }
  BitsWriter::bit_flush(this_00);
  for (local_2c = 0; local_2c < 0x10; local_2c = local_2c + 1) {
    if ((void *)local_d8[local_2c] != (void *)0x0) {
      operator_delete__((void *)local_d8[local_2c]);
    }
  }
  if (local_50 != (uint32_t *)0x0) {
    operator_delete__(local_50);
  }
  if (local_38 != (void *)0x0) {
    operator_delete__(local_38);
  }
  *local_20 = this_00->written;
  if (this_00 != (BitsWriter *)0x0) {
    operator_delete(this_00);
  }
  return;
}

Assistant:

inline void VSEncodingBlocks::encodeVS(uint32_t len, const uint32_t *in,
                                uint32_t &size, uint32_t *out) {
  uint32_t i;
  uint32_t j;
  uint32_t *logs;
  uint32_t numBlocks;
  uint32_t maxB;
  uint32_t ntotal;
  uint32_t *part;
  uint32_t *blocks[VSEBLOCKS_LOGS_LEN];
  uint32_t blockCur[VSEBLOCKS_LOGS_LEN];
  uint32_t countBlocksLogs[VSEBLOCKS_LOGS_LEN];
  BitsWriter *wt;

  logs = new uint32_t[len];

  if (logs == NULL)
    fprintf(stderr, "Can't allocate memory\n");

  /* Compute logs of all numbers */
  for (i = 0; i < len; i++)
    logs[i] = __vseblocks_remapLogs[1 + asmbits(in[i])];

  /* Compute optimal partition */
  part = __vseblocks->compute_OptPartition(
      logs, len, VSEBLOCKS_LOGLEN + VSEBLOCKS_LOGLOG, numBlocks);

  /* Ready to write */
  wt = new BitsWriter(out);

  if (wt == NULL)
    fprintf(stderr, "Can't initialize a class\n");

  /* countBlocksLogs[i] says how many blocks uses i bits */
  for (i = 0; i < VSEBLOCKS_LOGS_LEN; i++) {
    countBlocksLogs[i] = 0;
    blockCur[i] = 0;
  }

  /* Count number of occs of each log */
  for (i = 0; i < numBlocks; i++) {
    /* Compute max B in the block */
    for (maxB = 0, j = part[i]; j < part[i + 1]; j++)
      if (maxB < logs[j])
        maxB = logs[j];

    countBlocksLogs[__vseblocks_codeLogs[maxB]] += part[i + 1] - part[i];
  }

  for (ntotal = 0, i = 1; i < VSEBLOCKS_LOGS_LEN; i++)
    if (countBlocksLogs[i] > 0)
      ntotal++;

  /* Write occs. zero is assumed to be present */
  wt->bit_writer(ntotal, 32);

  /* For each logs write it and the number of its occurrences */
  for (i = 1; i < VSEBLOCKS_LOGS_LEN; i++) {
    if (countBlocksLogs[i] > 0) {
      wt->bit_writer(countBlocksLogs[i], 28);
      wt->bit_writer(i, 4);
    }
  }

  /* Prepare arrays to store groups of elements */
  for (blocks[0] = 0, i = 1; i < VSEBLOCKS_LOGS_LEN; i++) {
    if (countBlocksLogs[i] > 0) {
      blocks[i] = new uint32_t[countBlocksLogs[i]];

      if (blocks[i] == NULL)
        fprintf(stderr, "Can't allocate memory\n");
    } else {
      blocks[i] = NULL;
    }
  }

  /* Permute the elements based on their values of B */
  for (i = 0; i < numBlocks; i++) {
    for (maxB = 0, j = part[i]; j < part[i + 1]; j++)
      if (maxB < logs[j])
        maxB = logs[j];

    if (!maxB)
      continue;

    for (j = part[i]; j < part[i + 1]; j++) {
      /* Save current element in its bucket */
      blocks[__vseblocks_codeLogs[maxB]][blockCur[__vseblocks_codeLogs[maxB]]] =
          in[j];
      blockCur[__vseblocks_codeLogs[maxB]]++;
    }
  }

  /* Write each bucket ... keeping byte alligment */
  for (i = 1; i < VSEBLOCKS_LOGS_LEN; i++) {
    for (j = 0; j < countBlocksLogs[i]; j++)
      wt->bit_writer(blocks[i][j], __vseblocks_possLogs[i]);

    /* Align to next word */
    if (countBlocksLogs[i] > 0)
      wt->bit_flush();
  }

  wt->bit_flush();

  /* write block codes... a byte each */
  for (i = 0; i < numBlocks; i++) {
    /* Compute max B in the block */
    for (j = part[i], maxB = 0; j < part[i + 1]; j++) {
      if (maxB < logs[j])
        maxB = logs[j];
    }

    if (maxB) {
      /* Compute the code for the block length */
      for (j = 0; j < VSEBLOCKS_LENS_LEN; j++) {
        if (part[i + 1] - part[i] == __vseblocks_possLens[j])
          break;
      }
    } else {
      /*
       * Treat runs of 0 in a different way.
       * Compute the code for the block length.
       */
      for (j = 0; j < VSEBLOCKS_LENS_LEN; j++) {
        if (part[i + 1] - part[i] == __vseblocks_posszLens[j])
          break;
      }
    }

    /* Writes the value of B and K */
    wt->bit_writer(__vseblocks_codeLogs[maxB], VSEBLOCKS_LOGLOG);
    wt->bit_writer(j, VSEBLOCKS_LOGLEN);
  }

  /* Align to 32-bit */
  wt->bit_flush();

  /* Finalization */
  for (i = 0; i < VSEBLOCKS_LOGS_LEN; i++)
    delete[] blocks[i];

  delete[] part;
  delete[] logs;

  size = wt->written;

  delete wt;
}